

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O1

int ReadResponseLineAndHeaders
              (SOCKINFO *info,http_parser_t *parser,int *timeout_secs,int *http_error_code)

{
  parse_status_t pVar1;
  int iVar2;
  parse_status_t pVar3;
  char buf [2048];
  char acStack_838 [2056];
  
  pVar1 = parser_parse_responseline(parser);
  if (pVar1 != PARSE_OK) {
    if (pVar1 != PARSE_INCOMPLETE) {
      return pVar1;
    }
    do {
      pVar1 = sock_read(info,acStack_838,0x800,timeout_secs);
      if ((int)pVar1 < 1) goto joined_r0x0010f3f0;
      iVar2 = membuffer_append(&(parser->msg).msg,acStack_838,(ulong)pVar1);
      if (iVar2 != 0) goto LAB_0010f3de;
      pVar1 = parser_parse_responseline(parser);
    } while (pVar1 == PARSE_INCOMPLETE);
    if (pVar1 != PARSE_OK) {
      return pVar1;
    }
  }
  pVar3 = parser_parse_headers(parser);
  if (pVar3 == PARSE_INCOMPLETE) {
    pVar1 = sock_read(info,acStack_838,0x800,timeout_secs);
    if (0 < (int)pVar1) {
      do {
        iVar2 = membuffer_append(&(parser->msg).msg,acStack_838,(ulong)pVar1);
        if (iVar2 != 0) {
LAB_0010f3de:
          parser->http_error_code = 500;
          return 3;
        }
        pVar1 = parser_parse_headers(parser);
        if (pVar1 != PARSE_INCOMPLETE) {
          if (pVar1 != PARSE_OK) {
            return pVar1;
          }
          if (parser->position != POS_ENTITY) {
            return 4;
          }
          return 4;
        }
        pVar1 = sock_read(info,acStack_838,0x800,timeout_secs);
      } while (0 < (int)pVar1);
    }
joined_r0x0010f3f0:
    if (pVar1 == PARSE_SUCCESS) {
      *http_error_code = 400;
      pVar1 = 0xffffff89;
    }
    else {
      *http_error_code = parser->http_error_code;
    }
  }
  else {
    pVar1 = pVar3;
    if ((pVar3 == PARSE_OK) && (pVar1 = PARSE_OK, parser->position != POS_ENTITY)) {
      pVar1 = pVar3;
    }
  }
  return pVar1;
}

Assistant:

static int ReadResponseLineAndHeaders(
	/*! Socket information object. */
	SOCKINFO *info,
	/*! HTTP Parser object. */
	http_parser_t *parser,
	/*! Time out value. */
	int *timeout_secs,
	/*! HTTP errror code returned. */
	int *http_error_code)
{
	parse_status_t status;
	int num_read;
	char buf[2 * 1024];
	int done = 0;
	int ret_code = 0;

	/*read response line */
	status = parser_parse_responseline(parser);
	switch (status) {
	case PARSE_OK:
		done = 1;
		break;
	case PARSE_INCOMPLETE:
		done = 0;
		break;
	default:
		/*error */
		return status;
	}
	while (!done) {
		num_read = sock_read(info, buf, sizeof(buf), timeout_secs);
		if (num_read > 0) {
			/* append data to buffer */
			ret_code = membuffer_append(
				&parser->msg.msg, buf, (size_t)num_read);
			if (ret_code != 0) {
				/* set failure status */
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
			status = parser_parse_responseline(parser);
			switch (status) {
			case PARSE_OK:
				done = 1;
				break;
			case PARSE_INCOMPLETE:
				done = 0;
				break;
			default:
				/*error */
				return status;
			}
		} else if (num_read == 0) {
			/* partial msg */
			*http_error_code = HTTP_BAD_REQUEST; /* or response */
			return UPNP_E_BAD_HTTPMSG;
		} else {
			*http_error_code = parser->http_error_code;
			return num_read;
		}
	}
	status = parser_parse_headers(parser);
	if ((status == (parse_status_t)PARSE_OK) &&
		(parser->position == (parser_pos_t)POS_ENTITY))
		done = 1;
	else if (status == (parse_status_t)PARSE_INCOMPLETE)
		done = 0;
	else
		/*error */
		return status;
	/*read headers */
	while (!done) {
		num_read = sock_read(info, buf, sizeof(buf), timeout_secs);
		if (num_read > 0) {
			/* append data to buffer */
			ret_code = membuffer_append(
				&parser->msg.msg, buf, (size_t)num_read);
			if (ret_code != 0) {
				/* set failure status */
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
			status = parser_parse_headers(parser);
			if (status == (parse_status_t)PARSE_OK &&
				parser->position == (parser_pos_t)POS_ENTITY)
				done = 1;
			else if (status == (parse_status_t)PARSE_INCOMPLETE)
				done = 0;
			else
				/*error */
				return status;
		} else if (num_read == 0) {
			/* partial msg */
			*http_error_code = HTTP_BAD_REQUEST; /* or response */
			return UPNP_E_BAD_HTTPMSG;
		} else {
			*http_error_code = parser->http_error_code;
			return num_read;
		}
	}

	return PARSE_OK;
}